

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_cookie_clearall(CookieInfo *cookies)

{
  Cookie *pCVar1;
  Cookie *co;
  
  if (cookies != (CookieInfo *)0x0) {
    co = cookies->cookies;
    while (co != (Cookie *)0x0) {
      pCVar1 = co->next;
      freecookie(co);
      co = pCVar1;
    }
    cookies->cookies = (Cookie *)0x0;
    cookies->numcookies = 0;
  }
  return;
}

Assistant:

void Curl_cookie_clearall(struct CookieInfo *cookies)
{
  if(cookies) {
    Curl_cookie_freelist(cookies->cookies, TRUE);
    cookies->cookies = NULL;
    cookies->numcookies = 0;
  }
}